

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleDumperPretty.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  Slice slice;
  ostream *poVar1;
  Value *sub;
  string_view attrName;
  string_view attrName_00;
  string_view attrName_01;
  string_view attrName_02;
  string buffer;
  Value local_158;
  StringSink sink;
  Builder b;
  Options local_80;
  Value local_50;
  Value local_40;
  Value local_30;
  Value local_20;
  int __fd;
  
  arangodb::velocypack::Builder::Builder(&b);
  arangodb::velocypack::Value::Value((Value *)&local_80,Object,false);
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,(Value *)&local_80);
  buffer._M_dataplus._M_p._0_1_ = 0xb;
  buffer._M_dataplus._M_p._4_4_ = 3;
  buffer._M_string_length = 0xc;
  attrName._M_str = "b";
  attrName._M_len = 1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName,(Value *)&buffer);
  sink.super_Sink._vptr_Sink._0_1_ = 3;
  sink.super_Sink._vptr_Sink._4_4_ = 1;
  sink._buffer = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(sink._buffer._1_7_,1);
  attrName_00._M_str = "a";
  attrName_00._M_len = 1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_00,(Value *)&sink);
  arangodb::velocypack::Value::Value(&local_158,Array,false);
  attrName_01._M_str = "l";
  attrName_01._M_len = 1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,attrName_01,&local_158)
  ;
  local_20._valueType = Int;
  local_20._cType = Int64;
  local_20._value.d = 4.94065645841247e-324;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,&local_20);
  local_30._valueType = Int;
  local_30._cType = Int64;
  local_30._value.d = 9.88131291682493e-324;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,&local_30);
  sub = &local_40;
  local_40._valueType = Int;
  local_40._cType = Int64;
  local_40._value.d = 1.48219693752374e-323;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,sub);
  arangodb::velocypack::Builder::close(&b,(int)sub);
  local_50._valueType = String;
  local_50._cType = CharPtr;
  local_50._value.d = 5.48453380266743e-318;
  __fd = 4;
  attrName_02._M_str = "name";
  attrName_02._M_len = 4;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,attrName_02,&local_50);
  arangodb::velocypack::Builder::close(&b,__fd);
  slice._start = arangodb::velocypack::Builder::start(&b);
  local_80.unsupportedTypeBehavior = FailOnUnsupportedType;
  local_80.paddingBehavior = Flexible;
  local_80.attributeTranslator = (AttributeTranslator *)0x0;
  local_80.customTypeHandler._0_5_ = 0;
  local_80.customTypeHandler._5_3_ = 0;
  local_80.buildUnindexedArrays = false;
  local_80.buildUnindexedObjects = false;
  local_80.singleLinePrettyPrint = false;
  local_80.keepTopLevelOpen = false;
  local_80.clearBuilderBeforeParse = true;
  local_80.validateUtf8Strings = false;
  local_80.checkAttributeUniqueness = false;
  local_80.escapeForwardSlashes = false;
  local_80.escapeControl = true;
  local_80.escapeUnicode = false;
  local_80.dumpAttributesInIndexOrder = true;
  local_80.unsupportedDoublesAsString = false;
  local_80.binaryAsHex = false;
  local_80.datesAsIntegers = false;
  local_80.disallowExternals = false;
  local_80.disallowCustom = false;
  local_80.disallowTags = false;
  local_80.disallowBCD = false;
  local_80.debugTags = false;
  local_80.nestingLimit = 0xffffffff;
  local_80.prettyPrint = true;
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  sink.super_Sink._vptr_Sink = (_func_int **)&PTR__Sink_00119c08;
  sink._buffer = &buffer;
  arangodb::velocypack::Dumper::dump(slice,&sink.super_Sink,&local_80);
  poVar1 = std::operator<<((ostream *)&std::cout,"Resulting JSON:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,(string *)&buffer);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&buffer);
  arangodb::velocypack::Builder::~Builder(&b);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  Builder b;
  // build an object with attribute names "b", "a", "l", "name"
  b(Value(ValueType::Object))("b", Value(12))("a", Value(true))(
      "l", Value(ValueType::Array))(Value(1))(Value(2))(Value(3))()(
      "name", Value("Gustav"))();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  Options dumperOptions;
  dumperOptions.prettyPrint = true;
  // now dump the Slice into an std::string
  std::string buffer;
  StringSink sink(&buffer);
  Dumper::dump(s, &sink, &dumperOptions);

  // and print it
  std::cout << "Resulting JSON:" << std::endl << buffer << std::endl;

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}